

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init_tests.cpp
# Opt level: O0

void __thiscall
wallet::init_tests::walletinit_verify_walletdir_no_trailing::walletinit_verify_walletdir_no_trailing
          (walletinit_verify_walletdir_no_trailing *this)

{
  long lVar1;
  long in_FS_OFFSET;
  ChainType in_stack_0000018c;
  InitWalletDirTestingSetup *in_stack_00000190;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  InitWalletDirTestingSetup::InitWalletDirTestingSetup(in_stack_00000190,in_stack_0000018c);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(walletinit_verify_walletdir_no_trailing)
{
    SetWalletDir(m_walletdir_path_cases["trailing"]);
    bool result = m_wallet_loader->verify();
    BOOST_CHECK(result == true);
    fs::path walletdir = m_args.GetPathArg("-walletdir");
    fs::path expected_path = fs::canonical(m_walletdir_path_cases["default"]);
    BOOST_CHECK_EQUAL(walletdir, expected_path);
}